

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O1

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  SQChar *pSVar6;
  long lVar7;
  long lVar8;
  longlong lVar9;
  size_t sVar10;
  SQRESULT SVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  char *pcVar15;
  char cVar16;
  long lVar17;
  long lVar18;
  SQInteger ti;
  SQFloat tf;
  SQChar *ts;
  SQChar *format;
  SQChar fmt [20];
  long local_b0;
  char *local_a8;
  long local_a0;
  size_t local_98;
  HSQUIRRELVM local_90;
  float local_84;
  SQChar *local_80;
  char *local_78;
  undefined8 local_70;
  char local_68 [24];
  SQInteger *local_50;
  SQChar **local_48;
  long local_40;
  long local_38;
  
  lVar5 = sq_getstring(v,nformatstringidx,&local_70);
  if (-1 < lVar5) {
    local_50 = outlen;
    local_48 = output;
    lVar5 = sq_getsize(v,nformatstringidx);
    local_98 = lVar5 + 2;
    pSVar6 = (SQChar *)sq_getscratchpad(v);
    if (0 < lVar5) {
      lVar17 = nformatstringidx + 1;
      lVar18 = 0;
      lVar13 = 0;
      local_a0 = 0;
      local_90 = v;
LAB_00109788:
      cVar3 = *(char *)(local_70 + lVar13);
      if (cVar3 == '%') {
        if (*(char *)(local_70 + 1 + lVar13) == '%') {
          lVar12 = 2;
          cVar3 = '%';
          goto LAB_001097b4;
        }
        local_80 = pSVar6;
        lVar7 = sq_gettop(v);
        lVar12 = local_70;
        if (lVar7 < lVar17) {
          SVar11 = sq_throwerror(v,"not enough parameters for the given format string");
          return SVar11;
        }
        lVar7 = lVar13 + 1;
        local_68[0] = '%';
        pcVar15 = (char *)(lVar13 + local_70 + 2);
        lVar14 = lVar13 + 2;
        lVar13 = lVar7;
        while (((ulong)*(byte *)(local_70 + lVar13) < 0x31 &&
               ((0x1280900000000U >> ((ulong)*(byte *)(local_70 + lVar13) & 0x3f) & 1) != 0))) {
          lVar13 = lVar13 + 1;
          lVar14 = lVar14 + 1;
          pcVar15 = pcVar15 + 1;
        }
        lVar8 = 0;
        do {
          local_38 = lVar17;
          if (9 < (int)*(char *)(local_70 + lVar13) - 0x30U) {
            *(undefined1 *)((long)&local_a8 + lVar8) = 0;
            if (lVar8 == 0) {
              local_a0 = 0;
            }
            else {
              local_40 = lVar18;
              local_a0 = strtoll((char *)&local_a8,&local_78,10);
              lVar18 = local_40;
            }
            if (*(char *)(lVar12 + lVar13) != '.') goto LAB_001098f8;
            lVar17 = 0;
            goto LAB_0010989a;
          }
          *(char *)((long)&local_a8 + lVar8) = *(char *)(local_70 + lVar13);
          lVar13 = lVar13 + 1;
          lVar8 = lVar8 + 1;
          lVar14 = lVar14 + 1;
          pcVar15 = pcVar15 + 1;
        } while (lVar8 != 3);
        pcVar15 = "width format too long";
        goto LAB_00109917;
      }
      lVar12 = 1;
      if ((long)local_98 <= lVar18) {
        __assert_fail("i < allocated",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/sqstdlib/sqstdstring.cpp"
                      ,0x54,"SQRESULT sqstd_format(HSQUIRRELVM, SQInteger, SQInteger *, SQChar **)")
        ;
      }
LAB_001097b4:
      pSVar6[lVar18] = cVar3;
      lVar18 = lVar18 + 1;
      lVar13 = lVar13 + lVar12;
      goto LAB_00109b0b;
    }
    lVar18 = 0;
LAB_00109b58:
    *local_50 = lVar18;
    pSVar6[lVar18] = '\0';
    *local_48 = pSVar6;
    local_b0 = 0;
    lVar5 = local_b0;
  }
  local_b0 = lVar5;
  return local_b0;
LAB_0010989a:
  if ((int)*pcVar15 - 0x30U < 10) goto code_r0x001098a6;
  *(undefined1 *)((long)&local_a8 + lVar17) = 0;
  lVar13 = lVar14;
  if (lVar17 != 0) {
    lVar9 = strtoll((char *)&local_a8,&local_78,10);
    local_a0 = local_a0 + lVar9;
  }
LAB_001098f8:
  v = local_90;
  lVar17 = lVar13 - lVar7;
  if (0x14 < lVar17) {
    pcVar15 = "format too long";
    goto LAB_00109917;
  }
  memcpy(local_68 + 1,(void *)(lVar12 + lVar7),lVar17 + 1);
  local_68[lVar17 + 2] = '\0';
  goto LAB_0010991f;
code_r0x001098a6:
  *(char *)((long)&local_a8 + lVar17) = *pcVar15;
  lVar17 = lVar17 + 1;
  lVar14 = lVar14 + 1;
  pcVar15 = pcVar15 + 1;
  if (lVar17 == 3) goto code_r0x001098b9;
  goto LAB_0010989a;
code_r0x001098b9:
  pcVar15 = "precision format too long";
LAB_00109917:
  v = local_90;
  lVar13 = sq_throwerror(local_90,pcVar15);
LAB_0010991f:
  lVar17 = local_38;
  if (lVar13 < 0) {
    return -1;
  }
  local_78 = (char *)0x0;
  local_a8 = (char *)0x0;
  local_84 = 0.0;
  bVar1 = *(byte *)(local_70 + lVar13);
  if (bVar1 < 99) {
    if ((bVar1 == 0x45) || (bVar1 == 0x47)) goto switchD_00109970_caseD_65;
    if (bVar1 != 0x58) goto switchD_00109970_caseD_68;
switchD_00109970_caseD_64:
    sVar10 = strlen(local_68);
    cVar3 = local_68[sVar10 - 1];
    cVar16 = 'l';
    lVar12 = 0;
    do {
      local_68[lVar12 + sVar10 + -1] = cVar16;
      cVar16 = "tell"[lVar12 + 3];
      lVar12 = lVar12 + 1;
    } while (lVar12 != 2);
    local_68[sVar10 + 1] = cVar3;
    local_68[sVar10 + 2] = '\0';
switchD_00109970_caseD_63:
    lVar12 = sq_getinteger(v,lVar17,&local_a8);
    if (-1 < lVar12) {
      lVar12 = local_a0 + 0x65;
      iVar4 = 0x69;
LAB_00109a2e:
      local_98 = local_98 + lVar12 + 1;
      pSVar6 = (SQChar *)sq_getscratchpad(v);
      if (iVar4 == 0x66) {
        iVar4 = snprintf(pSVar6 + lVar18,local_98,local_68,(double)local_84);
LAB_00109ace:
        lVar18 = lVar18 + iVar4;
      }
      else {
        pcVar15 = local_a8;
        if ((iVar4 == 0x69) || (pcVar15 = local_78, iVar4 == 0x73)) {
          iVar4 = snprintf(pSVar6 + lVar18,local_98,local_68,pcVar15);
          goto LAB_00109ace;
        }
      }
      lVar13 = lVar13 + 1;
      lVar17 = lVar17 + 1;
      bVar2 = true;
      goto LAB_00109b03;
    }
    pcVar15 = "integer expected for the specified format";
  }
  else {
    switch(bVar1) {
    case 99:
      goto switchD_00109970_caseD_63;
    case 100:
    case 0x69:
    case 0x6f:
    case 0x75:
    case 0x78:
      goto switchD_00109970_caseD_64;
    case 0x65:
    case 0x66:
    case 0x67:
switchD_00109970_caseD_65:
      lVar12 = sq_getfloat(v,local_38,&local_84);
      if (lVar12 < 0) {
        pcVar15 = "float expected for the specified format";
        break;
      }
      lVar12 = local_a0 + 0x65;
      iVar4 = 0x66;
      goto LAB_00109a2e;
    default:
switchD_00109970_caseD_68:
      pcVar15 = "invalid format";
      break;
    case 0x73:
      lVar12 = sq_getstring(v,local_38,&local_78);
      if (-1 < lVar12) {
        lVar12 = sq_getsize(v,lVar17);
        lVar12 = lVar12 + local_a0 + 1;
        iVar4 = 0x73;
        goto LAB_00109a2e;
      }
      pcVar15 = "string expected for the specified format";
    }
  }
  local_b0 = sq_throwerror(v,pcVar15);
  bVar2 = false;
  pSVar6 = local_80;
LAB_00109b03:
  if (!bVar2) {
    return local_b0;
  }
LAB_00109b0b:
  if (lVar5 <= lVar13) goto LAB_00109b58;
  goto LAB_00109788;
}

Assistant:

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)
{
    const SQChar *format;
    SQChar *dest;
    SQChar fmt[MAX_FORMAT_LEN];
    const SQRESULT res = sq_getstring(v,nformatstringidx,&format);
    if (SQ_FAILED(res)) {
        return res; // propagate the error
    }
    SQInteger format_size = sq_getsize(v,nformatstringidx);
    SQInteger allocated = (format_size+2)*sizeof(SQChar);
    dest = sq_getscratchpad(v,allocated);
    SQInteger n = 0,i = 0, nparam = nformatstringidx+1, w = 0;
    //while(format[n] != '\0')
    while(n < format_size)
    {
        if(format[n] != '%') {
            assert(i < allocated);
            dest[i++] = format[n];
            n++;
        }
        else if(format[n+1] == '%') { //handles %%
                dest[i++] = '%';
                n += 2;
        }
        else {
            n++;
            if( nparam > sq_gettop(v) )
                return sq_throwerror(v,_SC("not enough parameters for the given format string"));
            n = validate_format(v,fmt,format,n,w);
            if(n < 0) return -1;
            SQInteger addlen = 0;
            SQInteger valtype = 0;
            const SQChar *ts = NULL;
            SQInteger ti = 0;
            SQFloat tf = 0;
            switch(format[n]) {
            case 's':
                if(SQ_FAILED(sq_getstring(v,nparam,&ts)))
                    return sq_throwerror(v,_SC("string expected for the specified format"));
                addlen = (sq_getsize(v,nparam)*sizeof(SQChar))+((w+1)*sizeof(SQChar));
                valtype = 's';
                break;
            case 'i': case 'd': case 'o': case 'u':  case 'x':  case 'X':
#ifdef _SQ64
                {
                size_t flen = scstrlen(fmt);
                SQInteger fpos = flen - 1;
                SQChar f = fmt[fpos];
                const SQChar *prec = (const SQChar *)_PRINT_INT_PREC;
                while(*prec != _SC('\0')) {
                    fmt[fpos++] = *prec++;
                }
                fmt[fpos++] = f;
                fmt[fpos++] = _SC('\0');
                }
#endif
            case 'c':
                if(SQ_FAILED(sq_getinteger(v,nparam,&ti)))
                    return sq_throwerror(v,_SC("integer expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'i';
                break;
            case 'f': case 'g': case 'G': case 'e':  case 'E':
                if(SQ_FAILED(sq_getfloat(v,nparam,&tf)))
                    return sq_throwerror(v,_SC("float expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'f';
                break;
            default:
                return sq_throwerror(v,_SC("invalid format"));
            }
            n++;
            allocated += addlen + sizeof(SQChar);
            dest = sq_getscratchpad(v,allocated);
            switch(valtype) {
            case 's': i += scsprintf(&dest[i],allocated,fmt,ts); break;
            case 'i': i += scsprintf(&dest[i],allocated,fmt,ti); break;
            case 'f': i += scsprintf(&dest[i],allocated,fmt,tf); break;
            };
            nparam ++;
        }
    }
    *outlen = i;
    dest[i] = '\0';
    *output = dest;
    return SQ_OK;
}